

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChLoadXYZROTnodeXYZROTnodeBushingMate::ChLoadXYZROTnodeXYZROTnodeBushingMate
          (ChLoadXYZROTnodeXYZROTnodeBushingMate *this,
          shared_ptr<chrono::fea::ChNodeFEAxyzrot> *mnodeA,
          shared_ptr<chrono::fea::ChNodeFEAxyzrot> *mnodeB,ChFrame<double> *abs_application,
          ChVector<double> *mstiffness,ChVector<double> *mdamping,ChVector<double> *mrotstiffness,
          ChVector<double> *mrotdamping)

{
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,
             &mnodeA->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &mnodeB->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>);
  ChLoadXYZROTnodeXYZROTnodeBushingSpherical::ChLoadXYZROTnodeXYZROTnodeBushingSpherical
            (&this->super_ChLoadXYZROTnodeXYZROTnodeBushingSpherical,
             (shared_ptr<chrono::fea::ChNodeFEAxyzrot> *)&local_50,
             (shared_ptr<chrono::fea::ChNodeFEAxyzrot> *)&local_40,abs_application,mstiffness,
             mdamping);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  (this->super_ChLoadXYZROTnodeXYZROTnodeBushingSpherical).super_ChLoadXYZROTnodeXYZROTnode.
  super_ChLoadCustomMultiple.super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadXYZROTnodeXYZROTnode_011770d8;
  (this->rot_stiffness).m_data[0] = mrotstiffness->m_data[0];
  (this->rot_stiffness).m_data[1] = mrotstiffness->m_data[1];
  (this->rot_stiffness).m_data[2] = mrotstiffness->m_data[2];
  (this->rot_damping).m_data[0] = mrotdamping->m_data[0];
  (this->rot_damping).m_data[1] = mrotdamping->m_data[1];
  (this->rot_damping).m_data[2] = mrotdamping->m_data[2];
  return;
}

Assistant:

ChLoadXYZROTnodeXYZROTnodeBushingMate::ChLoadXYZROTnodeXYZROTnodeBushingMate(
    std::shared_ptr<ChNodeFEAxyzrot> mnodeA,  ///< node A
    std::shared_ptr<ChNodeFEAxyzrot> mnodeB,  ///< node B
    const ChFrame<>& abs_application,
    const ChVector<>& mstiffness,
    const ChVector<>& mdamping,
    const ChVector<>& mrotstiffness,
    const ChVector<>& mrotdamping)
    : ChLoadXYZROTnodeXYZROTnodeBushingSpherical(mnodeA, mnodeB, abs_application, mstiffness, mdamping),
      rot_stiffness(mrotstiffness),
      rot_damping(mrotdamping) {}